

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLParser.cpp
# Opt level: O2

void __thiscall xe::xml::Tokenizer::Tokenizer(Tokenizer *this)

{
  this->m_curToken = TOKEN_INCOMPLETE;
  this->m_curTokenLen = 0;
  this->m_state = STATE_DATA;
  de::RingBuffer<unsigned_char>::RingBuffer(&this->m_buf,0x400);
  return;
}

Assistant:

Tokenizer::Tokenizer (void)
	: m_curToken	(TOKEN_INCOMPLETE)
	, m_curTokenLen	(0)
	, m_state		(STATE_DATA)
	, m_buf			(TOKENIZER_INITIAL_BUFFER_SIZE)
{
}